

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::format_uint<4u,char,fmt::v7::detail::buffer_appender<char>,unsigned_int>
          (buffer_appender<char> out,uint value,int num_digits,bool upper)

{
  type tVar1;
  char *buffer_00;
  char buffer [9];
  char local_29 [9];
  
  tVar1 = to_unsigned<int>(num_digits);
  buffer_00 = to_pointer<char>(out,(ulong)tVar1);
  if (buffer_00 == (char *)0x0) {
    format_uint<4u,char,unsigned_int>(local_29,value,num_digits,upper);
    out = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,fmt::v7::detail::buffer_appender<char>>(local_29,local_29 + num_digits,out)
    ;
  }
  else {
    format_uint<4u,char,unsigned_int>(buffer_00,value,num_digits,upper);
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

inline It format_uint(It out, UInt value, int num_digits, bool upper = false) {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str<Char>(buffer, buffer + num_digits, out);
}